

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::simpleOrWithEq(Tokenizer *this,char c,TokenType type,TokenType typeEq)

{
  char cVar1;
  int iVar2;
  Mark *pMVar3;
  char in_SIL;
  Token *in_RDI;
  Mark mark;
  Token *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  TokenType *in_stack_fffffffffffffed8;
  allocator<char> *type_00;
  undefined8 local_111;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [92];
  Mark local_24;
  char local_11;
  bool local_1;
  
  local_11 = in_SIL;
  pMVar3 = Stream::getMark((Stream *)in_RDI);
  local_24 = *pMVar3;
  cVar1 = Stream::peek((Stream *)0x16591e);
  if (cVar1 == local_11) {
    iVar2 = Stream::advance((Stream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
    ;
    if (iVar2 == 0x3d) {
      iVar2 = (int)local_11;
      type_00 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (size_type)type_00,(char)((uint)iVar2 >> 0x18),
                 (allocator<char> *)in_stack_fffffffffffffec8);
      std::operator+(in_stack_fffffffffffffec8,
                     (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      Token::Token(in_RDI,(TokenType *)type_00,(string *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                   (Mark *)in_stack_fffffffffffffec8);
      Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8);
      Token::~Token((Token *)0x1659e7);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      Stream::advance((Stream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    else {
      iVar2 = (int)local_11;
      pMVar3 = (Mark *)&local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (size_type)in_stack_fffffffffffffed8,
                 (char)((uint)in_stack_fffffffffffffed4 >> 0x18),(allocator<char> *)pMVar3);
      Token::Token(in_RDI,in_stack_fffffffffffffed8,
                   (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),pMVar3);
      Token::operator=((Token *)CONCAT44(iVar2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8)
      ;
      Token::~Token((Token *)0x165afc);
      std::__cxx11::string::~string((string *)((long)&local_111 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tokenizer::simpleOrWithEq(char c, TokenType type, TokenType typeEq)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == '=')
    {
      token_ = Token{typeEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{type, std::string(1, c), mark};
  }
  else 
    return false;
  
  return true;
}